

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_level_ps_static.cxx
# Opt level: O2

void __thiscall xray_re::xr_level_ps_static::load(xr_level_ps_static *this,xr_reader *r)

{
  uint32_t *puVar1;
  uint16_t *puVar2;
  uint8_t *puVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  uint16_t uVar11;
  size_t sVar12;
  uint32_t uVar13;
  particle_data *particle;
  xr_reader *s;
  
  sVar12 = xr_reader::find_chunk(r,0);
  if (sVar12 == 4) {
    puVar1 = (r->field_2).m_p_u32;
    (r->field_2).m_p = (uint8_t *)(puVar1 + 1);
    uVar13 = *puVar1;
    this->m_version = uVar13;
    if (uVar13 != 1) {
      __assert_fail("m_version == PS_VERSION_1",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_level_ps_static.cxx"
                    ,0x10,"void xray_re::xr_level_ps_static::load(xr_reader &)");
    }
  }
  else {
    this->m_version = 0;
  }
  uVar13 = (uint32_t)(sVar12 == 4);
  while( true ) {
    s = xr_reader::open_chunk(r,uVar13);
    if (s == (xr_reader *)0x0) break;
    particle = (particle_data *)operator_new(0x68);
    (particle->reference)._M_dataplus._M_p = (pointer)&(particle->reference).field_2;
    (particle->reference)._M_string_length = 0;
    (particle->reference).field_2._M_local_buf[0] = '\0';
    std::vector<xray_re::particle_data_*,_std::allocator<xray_re::particle_data_*>_>::push_back
              (&this->m_particles,&particle);
    if (this->m_version == 0) {
      uVar11 = 0xffff;
    }
    else {
      puVar2 = (r->field_2).m_p_u16;
      (r->field_2).m_p = (uint8_t *)(puVar2 + 1);
      uVar11 = *puVar2;
    }
    particle->extra = uVar11;
    xr_reader::r_sz(r,&particle->reference);
    puVar3 = (r->field_2).m_p;
    uVar4 = *(undefined8 *)puVar3;
    uVar5 = *(undefined8 *)(puVar3 + 8);
    uVar6 = *(undefined8 *)(puVar3 + 0x10);
    uVar7 = *(undefined8 *)(puVar3 + 0x18);
    uVar8 = *(undefined8 *)(puVar3 + 0x20);
    uVar9 = *(undefined8 *)(puVar3 + 0x28);
    uVar10 = *(undefined8 *)(puVar3 + 0x38);
    *(undefined8 *)((long)&(particle->xform).field_0 + 0x30) = *(undefined8 *)(puVar3 + 0x30);
    *(undefined8 *)((long)&(particle->xform).field_0 + 0x38) = uVar10;
    *(undefined8 *)((long)&(particle->xform).field_0 + 0x20) = uVar8;
    *(undefined8 *)((long)&(particle->xform).field_0 + 0x28) = uVar9;
    *(undefined8 *)((long)&(particle->xform).field_0 + 0x10) = uVar6;
    *(undefined8 *)((long)&(particle->xform).field_0 + 0x18) = uVar7;
    *(undefined8 *)&(particle->xform).field_0 = uVar4;
    *(undefined8 *)((long)&(particle->xform).field_0 + 8) = uVar5;
    (r->field_2).m_p = (r->field_2).m_p + 0x40;
    xr_reader::close_chunk(r,&s);
    uVar13 = uVar13 + 1;
  }
  return;
}

Assistant:

void xr_level_ps_static::load(xr_reader& r)
{
	if (r.find_chunk(PS_CHUNK_VERSION) == sizeof(uint32_t)) {
		m_version = r.r_u32();
		xr_assert(m_version == PS_VERSION_1);
	} else {
		m_version = PS_VERSION_0;
	}
	// compiler will optimize this, so no explicit (id = version) trick.
	uint32_t id = (m_version == PS_VERSION_0) ? 0 : 1;
	for (xr_reader* s; (s = r.open_chunk(id)); ++id) {
		particle_data* particle = new particle_data;
		m_particles.push_back(particle);
		particle->extra = (m_version == PS_VERSION_0) ? 0xffff : r.r_u16();
		r.r_sz(particle->reference);
		r.r(particle->xform);
		r.close_chunk(s);
	}
}